

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjCompress2(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelFormat,
               uchar **jpegBuf,unsigned_long *jpegSize,int jpegSubsamp,int jpegQual,int flags)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  undefined8 *puVar5;
  char *pcVar6;
  unsigned_long uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 uVar12;
  
  if (handle == (tjhandle)0x0) {
    puVar5 = (undefined8 *)__tls_get_addr(&PTR_0019df20);
    *(undefined8 *)((long)puVar5 + 7) = 0x656c646e616820;
    *puVar5 = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  if ((*(byte *)((long)handle + 0x600) & 1) == 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjCompress2(): Instance has not been initialized for compression",0x41);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pvVar4 = (void *)__tls_get_addr(&PTR_0019df20);
    memcpy(pvVar4,"tjCompress2(): Instance has not been initialized for compression",0x41);
  }
  else {
    if ((((uint)jpegSubsamp < 6 && jpegSize != (unsigned_long *)0x0) &&
        (jpegBuf != (uchar **)0x0 &&
        ((uint)pixelFormat < 0xc &&
        ((0 < height && srcBuf != (uchar *)0x0) && (-1 < pitch && 0 < width))))) &&
        (uint)jpegQual < 0x65) {
      if (pitch == 0) {
        pitch = tjPixelSize[(uint)pixelFormat] * width;
      }
      pvVar4 = malloc((ulong)(uint)height * 8);
      if (pvVar4 != (void *)0x0) {
        iVar2 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
        if (iVar2 != 0) {
          uVar3 = 0xffffffff;
          cVar1 = '\0';
          goto LAB_00136db0;
        }
        *(int *)((long)handle + 0x30) = width;
        *(int *)((long)handle + 0x34) = height;
        if ((flags & 8U) == 0) {
          if ((flags & 0x10U) != 0) {
            pcVar6 = "JSIMD_FORCESSE=1";
            goto LAB_00136e2c;
          }
          if ((flags & 0x20U) != 0) {
            pcVar6 = "JSIMD_FORCESSE2=1";
            goto LAB_00136e2c;
          }
        }
        else {
          pcVar6 = "JSIMD_FORCEMMX=1";
LAB_00136e2c:
          putenv(pcVar6);
        }
        uVar3 = flags & 0x400;
        if (uVar3 != 0) {
          uVar7 = tjBufSize(width,height,jpegSubsamp);
          *jpegSize = uVar7;
        }
        jpeg_mem_dest_tj((j_compress_ptr)handle,jpegBuf,jpegSize,(uint)(uVar3 == 0));
        setCompDefaults((jpeg_compress_struct *)handle,pixelFormat,jpegSubsamp,jpegQual,flags);
        jpeg_start_compress((j_compress_ptr)handle,1);
        if (0 < height) {
          uVar9 = 0;
          uVar11 = uVar9;
          do {
            uVar10 = uVar9;
            if ((flags & 2U) != 0) {
              uVar10 = (~uVar11 + (ulong)(uint)height) * (long)pitch;
            }
            *(uchar **)((long)pvVar4 + uVar11 * 8) = srcBuf + uVar10;
            uVar11 = uVar11 + 1;
            uVar9 = uVar9 + (long)pitch;
          } while ((uint)height != uVar11);
        }
        cVar1 = (char)(uVar3 >> 10);
        uVar3 = *(uint *)((long)handle + 0x34);
        uVar8 = *(uint *)((long)handle + 0x130);
        if (uVar8 < uVar3) {
          do {
            jpeg_write_scanlines
                      ((j_compress_ptr)handle,(JSAMPARRAY)((long)pvVar4 + (ulong)uVar8 * 8),
                       uVar3 - uVar8);
            uVar3 = *(uint *)((long)handle + 0x34);
            uVar8 = *(uint *)((long)handle + 0x130);
          } while (uVar8 < uVar3);
        }
        jpeg_finish_compress((j_compress_ptr)handle);
        uVar3 = 0;
        goto LAB_00136db0;
      }
      builtin_strncpy((char *)((long)handle + 0x621),"ocation ",8);
      builtin_strncpy((char *)((long)handle + 0x629),"failure",8);
      builtin_strncpy((char *)((long)handle + 0x618),"emory al",8);
      builtin_strncpy((char *)((long)handle + 0x620),"location",8);
      builtin_strncpy((char *)((long)handle + 0x608),"tjCo",4);
      builtin_strncpy((char *)((long)handle + 0x60c),"mpre",4);
      builtin_strncpy((char *)((long)handle + 0x610),"ss2(",4);
      builtin_strncpy((char *)((long)handle + 0x614),"): M",4);
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      pcVar6 = (char *)__tls_get_addr(&PTR_0019df20);
      builtin_strncpy(pcVar6 + 0x10,"emory allocation failure",0x19);
      uVar12._0_1_ = ')';
      uVar12._1_1_ = ':';
      uVar12._2_1_ = ' ';
      uVar12._3_1_ = 'M';
    }
    else {
      builtin_strncpy((char *)((long)handle + 0x618),"nvalid a",8);
      builtin_strncpy((char *)((long)handle + 0x620),"rgument",8);
      builtin_strncpy((char *)((long)handle + 0x608),"tjCo",4);
      builtin_strncpy((char *)((long)handle + 0x60c),"mpre",4);
      builtin_strncpy((char *)((long)handle + 0x610),"ss2(",4);
      builtin_strncpy((char *)((long)handle + 0x614),"): I",4);
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      pcVar6 = (char *)__tls_get_addr(&PTR_0019df20);
      builtin_strncpy(pcVar6 + 0x10,"nvalid argument",0x10);
      uVar12._0_1_ = ')';
      uVar12._1_1_ = ':';
      uVar12._2_1_ = ' ';
      uVar12._3_1_ = 'I';
    }
    pcVar6[0] = 't';
    pcVar6[1] = 'j';
    pcVar6[2] = 'C';
    pcVar6[3] = 'o';
    pcVar6[4] = 'm';
    pcVar6[5] = 'p';
    pcVar6[6] = 'r';
    pcVar6[7] = 'e';
    pcVar6[8] = 's';
    pcVar6[9] = 's';
    pcVar6[10] = '2';
    pcVar6[0xb] = '(';
    *(undefined4 *)(pcVar6 + 0xc) = uVar12;
  }
  uVar3 = 0xffffffff;
  cVar1 = '\0';
  pvVar4 = (void *)0x0;
LAB_00136db0:
  if (100 < *(int *)((long)handle + 0x24)) {
    if (cVar1 == '\0') {
      (**(code **)(*(long *)((long)handle + 0x28) + 0x20))(handle);
    }
    jpeg_abort_compress((j_compress_ptr)handle);
  }
  free(pvVar4);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar3;
}

Assistant:

DLLEXPORT int tjCompress2(tjhandle handle, const unsigned char *srcBuf,
                          int width, int pitch, int height, int pixelFormat,
                          unsigned char **jpegBuf, unsigned long *jpegSize,
                          int jpegSubsamp, int jpegQual, int flags)
{
  int i, retval = 0, alloc = 1;
  JSAMPROW *row_pointer = NULL;

  GET_CINSTANCE(handle)
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;
  if ((this->init & COMPRESS) == 0)
    THROW("tjCompress2(): Instance has not been initialized for compression");

  if (srcBuf == NULL || width <= 0 || pitch < 0 || height <= 0 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF || jpegBuf == NULL ||
      jpegSize == NULL || jpegSubsamp < 0 || jpegSubsamp >= NUMSUBOPT ||
      jpegQual < 0 || jpegQual > 100)
    THROW("tjCompress2(): Invalid argument");

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];

  if ((row_pointer = (JSAMPROW *)malloc(sizeof(JSAMPROW) * height)) == NULL)
    THROW("tjCompress2(): Memory allocation failure");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  cinfo->image_width = width;
  cinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_NOREALLOC) {
    alloc = 0;  *jpegSize = tjBufSize(width, height, jpegSubsamp);
  }
  jpeg_mem_dest_tj(cinfo, jpegBuf, jpegSize, alloc);
  setCompDefaults(cinfo, pixelFormat, jpegSubsamp, jpegQual, flags);

  jpeg_start_compress(cinfo, TRUE);
  for (i = 0; i < height; i++) {
    if (flags & TJFLAG_BOTTOMUP)
      row_pointer[i] = (JSAMPROW)&srcBuf[(height - i - 1) * (size_t)pitch];
    else
      row_pointer[i] = (JSAMPROW)&srcBuf[i * (size_t)pitch];
  }
  while (cinfo->next_scanline < cinfo->image_height)
    jpeg_write_scanlines(cinfo, &row_pointer[cinfo->next_scanline],
                         cinfo->image_height - cinfo->next_scanline);
  jpeg_finish_compress(cinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) {
    if (alloc) (*cinfo->dest->term_destination) (cinfo);
    jpeg_abort_compress(cinfo);
  }
  free(row_pointer);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}